

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::Pop(SQVM *this,SQInteger n)

{
  long in_RSI;
  SQTable *pos;
  SQObjectPtr *in_RDI;
  SQInteger i;
  long local_18;
  
  for (local_18 = 0; local_18 < in_RSI; local_18 = local_18 + 1) {
    pos = (SQTable *)(in_RDI[4].super_SQObject._unVal.nInteger - 1);
    in_RDI[4].super_SQObject._unVal.pTable = pos;
    sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(in_RDI + 3),(SQUnsignedInteger)pos);
    ::SQObjectPtr::Null(in_RDI);
  }
  return;
}

Assistant:

void SQVM::Pop(SQInteger n) {
    for(SQInteger i = 0; i < n; i++){
        _stack[--_top].Null();
    }
}